

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O3

JSValue js_os_readlink(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  char *__path;
  ssize_t sVar1;
  int *piVar2;
  int err;
  JSValue JVar3;
  char buf [4096];
  char local_1028 [4104];
  
  __path = JS_ToCStringLen2(ctx,(size_t *)0x0,*argv,0);
  if (__path == (char *)0x0) {
    JVar3 = (JSValue)(ZEXT816(6) << 0x40);
  }
  else {
    sVar1 = readlink(__path,local_1028,0xfff);
    if (sVar1 < 0) {
      local_1028[0] = '\0';
      piVar2 = __errno_location();
      err = *piVar2;
    }
    else {
      local_1028[sVar1] = '\0';
      err = 0;
    }
    JS_FreeCString(ctx,__path);
    JVar3 = JS_NewString(ctx,local_1028);
    JVar3 = make_obj_error(ctx,JVar3,err);
  }
  return JVar3;
}

Assistant:

static JSValue js_os_readlink(JSContext *ctx, JSValueConst this_val,
                              int argc, JSValueConst *argv)
{
    const char *path;
    char buf[PATH_MAX];
    int err;
    ssize_t res;
    
    path = JS_ToCString(ctx, argv[0]);
    if (!path)
        return JS_EXCEPTION;
    res = readlink(path, buf, sizeof(buf) - 1);
    if (res < 0) {
        buf[0] = '\0';
        err = errno;
    } else {
        buf[res] = '\0';
        err = 0;
    }
    JS_FreeCString(ctx, path);
    return make_string_error(ctx, buf, err);
}